

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_socket.c
# Opt level: O2

amqp_rpc_reply_t *
amqp_login_with_properties
          (amqp_rpc_reply_t *__return_storage_ptr__,amqp_connection_state_t state,char *vhost,
          int channel_max,int frame_max,int heartbeat,amqp_table_t *client_properties,
          amqp_sasl_method_enum sasl_method,...)

{
  char in_AL;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list vl;
  undefined1 local_b8 [48];
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  undefined8 local_18;
  
  if (in_AL != '\0') {
    local_88 = in_XMM0_Qa;
    local_78 = in_XMM1_Qa;
    local_68 = in_XMM2_Qa;
    local_58 = in_XMM3_Qa;
    local_48 = in_XMM4_Qa;
    local_38 = in_XMM5_Qa;
    local_28 = in_XMM6_Qa;
    local_18 = in_XMM7_Qa;
  }
  vl[0].reg_save_area = local_b8;
  vl[0].overflow_arg_area = &stack0x00000018;
  vl[0].gp_offset = 0x30;
  vl[0].fp_offset = 0x30;
  amqp_login_inner(__return_storage_ptr__,state,vhost,channel_max,frame_max,heartbeat,
                   client_properties,state->handshake_timeout,sasl_method,vl);
  return __return_storage_ptr__;
}

Assistant:

amqp_rpc_reply_t amqp_login_with_properties(
    amqp_connection_state_t state, char const *vhost, int channel_max,
    int frame_max, int heartbeat, const amqp_table_t *client_properties,
    amqp_sasl_method_enum sasl_method, ...) {
  va_list vl;
  amqp_rpc_reply_t ret;

  va_start(vl, sasl_method);

  ret = amqp_login_inner(state, vhost, channel_max, frame_max, heartbeat,
                         client_properties, state->handshake_timeout,
                         sasl_method, vl);

  va_end(vl);

  return ret;
}